

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

int google::protobuf::UnescapeCEscapeString
              (string *src,string *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  int iVar1;
  char *dest_00;
  LogMessage *other;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *errors_00;
  LogFinisher local_59;
  LogMessage local_58;
  
  dest_00 = (char *)operator_new__(src->_M_string_length + 1);
  iVar1 = UnescapeCEscapeSequences((src->_M_dataplus)._M_p,dest_00,errors_00);
  if (dest == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/strutil.cc",0x1c8);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: dest: ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  std::__cxx11::string::_M_replace((ulong)dest,0,(char *)dest->_M_string_length,(ulong)dest_00);
  operator_delete__(dest_00);
  return iVar1;
}

Assistant:

int UnescapeCEscapeString(const std::string &src, std::string *dest,
                          std::vector<std::string> *errors) {
  std::unique_ptr<char[]> unescaped(new char[src.size() + 1]);
  int len = UnescapeCEscapeSequences(src.c_str(), unescaped.get(), errors);
  GOOGLE_CHECK(dest);
  dest->assign(unescaped.get(), len);
  return len;
}